

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrfile.c
# Opt level: O3

int file_compress_open(char *filename,int rwmode,int *hdl)

{
  int iVar1;
  FILE *pFVar2;
  char *__filename;
  FILE *indiskfile;
  int local_3c;
  FILE *local_38;
  
  iVar1 = file_openfile(filename,0,(FILE **)&local_38);
  local_3c = iVar1;
  if (iVar1 != 0) {
    ffpmsg("failed to open compressed disk file (file_compress_open)");
    ffpmsg(filename);
    return iVar1;
  }
  if (file_outfile[0] == '!') {
    __filename = file_outfile + 1;
    remove(file_outfile + 1);
  }
  else {
    __filename = file_outfile;
    pFVar2 = fopen64(file_outfile,"r");
    if (pFVar2 != (FILE *)0x0) {
      ffpmsg("uncompressed file already exists: (file_compress_open)");
      ffpmsg(file_outfile);
      fclose(pFVar2);
      file_outfile[0] = '\0';
      return 0x69;
    }
  }
  pFVar2 = fopen64(__filename,"w+b");
  if (pFVar2 == (FILE *)0x0) {
    ffpmsg("could not create uncompressed file: (file_compress_open)");
    ffpmsg(file_outfile);
    file_outfile[0] = '\0';
    return 0x69;
  }
  uncompress2file(filename,(FILE *)local_38,(FILE *)pFVar2,&local_3c);
  fclose(local_38);
  fclose(pFVar2);
  if (local_3c == 0) {
    strcpy(filename,__filename);
    file_outfile[0] = '\0';
    iVar1 = file_open(filename,rwmode,hdl);
    return iVar1;
  }
  ffpmsg("error in file_compress_open: failed to uncompressed file:");
  ffpmsg(filename);
  ffpmsg(" into new output file:");
  ffpmsg(file_outfile);
  file_outfile[0] = '\0';
  return local_3c;
}

Assistant:

int file_compress_open(char *filename, int rwmode, int *hdl)
/*
  This routine opens the compressed diskfile by creating a new uncompressed
  file then opening it.  The input file name (the name of the compressed
  file) gets replaced with the name of the uncompressed file, which is
  initially stored in the global file_outfile string.   file_outfile
  then gets set to a null string.
*/
{
    FILE *indiskfile, *outdiskfile;
    int status;
    char *cptr;

    /* open the compressed disk file */
    status = file_openfile(filename, READONLY, &indiskfile);
    if (status)
    {
        ffpmsg("failed to open compressed disk file (file_compress_open)");
        ffpmsg(filename);
        return(status);
    }

    /* name of the output uncompressed file is stored in the */
    /* global variable called 'file_outfile'.                */

    cptr = file_outfile;
    if (*cptr == '!')
    {
        /* clobber any existing file with the same name */
        cptr++;
        remove(cptr);
    }
    else
    {
        outdiskfile = fopen(file_outfile, "r"); /* does file already exist? */

        if (outdiskfile)
        {
          ffpmsg("uncompressed file already exists: (file_compress_open)");
          ffpmsg(file_outfile);
          fclose(outdiskfile);         /* close file and exit with error */
	  file_outfile[0] = '\0';
          return(FILE_NOT_CREATED); 
        }
    }

    outdiskfile = fopen(cptr, "w+b"); /* create new file */
    if (!outdiskfile)
    {
        ffpmsg("could not create uncompressed file: (file_compress_open)");
        ffpmsg(file_outfile);
	file_outfile[0] = '\0';
        return(FILE_NOT_CREATED); 
    }

    /* uncompress file into another file */
    uncompress2file(filename, indiskfile, outdiskfile, &status);
    fclose(indiskfile);
    fclose(outdiskfile);

    if (status)
    {
        ffpmsg("error in file_compress_open: failed to uncompressed file:");
        ffpmsg(filename);
        ffpmsg(" into new output file:");
        ffpmsg(file_outfile);
	file_outfile[0] = '\0';
        return(status);
    }

    strcpy(filename, cptr);  /* switch the names */
    file_outfile[0] = '\0';

    status = file_open(filename, rwmode, hdl);

    return(status);
}